

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  int iVar1;
  ImGuiContext_conflict *pIVar2;
  size_t sVar3;
  char *pcVar4;
  char *text_end;
  ImGuiContext_conflict *g;
  char *text_local;
  void *param_0_local;
  
  pIVar2 = GImGui;
  ImVector<char>::clear(&GImGui->ClipboardHandlerData);
  sVar3 = strlen(text);
  iVar1 = (int)(text + sVar3);
  ImVector<char>::resize(&pIVar2->ClipboardHandlerData,(iVar1 - (int)text) + 1);
  pcVar4 = ImVector<char>::operator[](&pIVar2->ClipboardHandlerData,0);
  memcpy(pcVar4,text,(long)(text + sVar3) - (long)text);
  pcVar4 = ImVector<char>::operator[](&pIVar2->ClipboardHandlerData,iVar1 - (int)text);
  *pcVar4 = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.ClipboardHandlerData.clear();
    const char* text_end = text + strlen(text);
    g.ClipboardHandlerData.resize((int)(text_end - text) + 1);
    memcpy(&g.ClipboardHandlerData[0], text, (size_t)(text_end - text));
    g.ClipboardHandlerData[(int)(text_end - text)] = 0;
}